

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::truncUFloat
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Unary *curr,
          Literal *value)

{
  char cVar1;
  uintptr_t uVar2;
  double dVar3;
  
  dVar3 = (double)::wasm::Literal::getFloat();
  if (NAN(dVar3)) {
    (*this->_vptr_ExpressionRunner[2])(this,"truncUFloat of nan");
  }
  uVar2 = (value->type).id;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id == 2) {
    if (uVar2 == 5) {
      cVar1 = ::wasm::isInRangeI32TruncU((value->field_0).i64);
    }
    else {
      if (uVar2 != 4) {
LAB_00196d52:
        __assert_fail("type == Type::f64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x146,"int64_t wasm::Literal::reinterpreti64() const");
      }
      cVar1 = ::wasm::isInRangeI32TruncU((value->field_0).i32);
    }
    if (cVar1 == '\0') {
      (*this->_vptr_ExpressionRunner[2])(this,"i32.truncUFloat overflow");
    }
    (__return_storage_ptr__->field_0).i32 = (int32_t)(long)dVar3;
    uVar2 = 2;
  }
  else {
    if (uVar2 == 5) {
      cVar1 = ::wasm::isInRangeI64TruncU((value->field_0).i64);
    }
    else {
      if (uVar2 != 4) goto LAB_00196d52;
      cVar1 = ::wasm::isInRangeI64TruncU((value->field_0).i32);
    }
    if (cVar1 == '\0') {
      (*this->_vptr_ExpressionRunner[2])(this,"i64.truncUFloat overflow");
    }
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len =
         (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
    uVar2 = 3;
  }
  (__return_storage_ptr__->type).id = uVar2;
  return __return_storage_ptr__;
}

Assistant:

Literal truncUFloat(Unary* curr, Literal value) {
    double val = value.getFloat();
    if (std::isnan(val)) {
      trap("truncUFloat of nan");
    }
    if (curr->type == Type::i32) {
      if (value.type == Type::f32) {
        if (!isInRangeI32TruncU(value.reinterpreti32())) {
          trap("i32.truncUFloat overflow");
        }
      } else {
        if (!isInRangeI32TruncU(value.reinterpreti64())) {
          trap("i32.truncUFloat overflow");
        }
      }
      return Literal(uint32_t(val));
    } else {
      if (value.type == Type::f32) {
        if (!isInRangeI64TruncU(value.reinterpreti32())) {
          trap("i64.truncUFloat overflow");
        }
      } else {
        if (!isInRangeI64TruncU(value.reinterpreti64())) {
          trap("i64.truncUFloat overflow");
        }
      }
      return Literal(uint64_t(val));
    }
  }